

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  bool bVar2;
  ImGuiTabBar *pIVar3;
  ImGuiPtrOrIndex *__src;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  ImGuiDockNode *pIVar6;
  ImGuiWindow *pIVar7;
  int iVar8;
  ImU32 col;
  ImGuiPtrOrIndex *__dest;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  size_t __nmemb;
  ImDrawList *this;
  ImGuiTabBar *pIVar13;
  ImVec2 local_50;
  ImGuiDockNode *local_48;
  ImGuiWindow *local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_40 = GImGui->CurrentWindow;
  bVar2 = local_40->SkipItems;
  if (bVar2 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar3 = (GImGui->TabBars).Buf.Data;
    iVar12 = -1;
    pIVar13 = tab_bar;
    if (pIVar3 <= tab_bar && tab_bar < pIVar3 + (GImGui->TabBars).Buf.Size) {
      iVar12 = (int)((ulong)((long)tab_bar - (long)pIVar3) >> 7);
      pIVar13 = (ImGuiTabBar *)0x0;
    }
    iVar8 = (pIVar5->CurrentTabBarStack).Size;
    local_48 = dock_node;
    if (iVar8 == (pIVar5->CurrentTabBarStack).Capacity) {
      if (iVar8 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar8 / 2 + iVar8;
      }
      iVar10 = iVar8 + 1;
      if (iVar8 + 1 < iVar9) {
        iVar10 = iVar9;
      }
      __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar10 << 4);
      __src = (pIVar5->CurrentTabBarStack).Data;
      if (__src != (ImGuiPtrOrIndex *)0x0) {
        memcpy(__dest,__src,(long)(pIVar5->CurrentTabBarStack).Size << 4);
        MemFree((pIVar5->CurrentTabBarStack).Data);
      }
      (pIVar5->CurrentTabBarStack).Data = __dest;
      (pIVar5->CurrentTabBarStack).Capacity = iVar10;
      iVar8 = (pIVar5->CurrentTabBarStack).Size;
    }
    else {
      __dest = (pIVar5->CurrentTabBarStack).Data;
    }
    pIVar7 = local_40;
    pIVar6 = local_48;
    __dest[iVar8].Ptr = pIVar13;
    __dest[iVar8].Index = iVar12;
    (pIVar5->CurrentTabBarStack).Size = (pIVar5->CurrentTabBarStack).Size + 1;
    pIVar5->CurrentTabBar = tab_bar;
    iVar12 = tab_bar->CurrFrameVisible;
    if (iVar12 != pIVar5->FrameCount) {
      if (((((flags & 1U) != 0) && ((tab_bar->Flags & 1) == 0)) &&
          (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) &&
         (tab_bar->PrevFrameVisible != -1)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x28,TabItemComparerByVisibleOffset);
        iVar12 = tab_bar->CurrFrameVisible;
      }
      uVar11 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar11 = flags;
      }
      tab_bar->Flags = uVar11;
      IVar4 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar4;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = iVar12;
      tab_bar->CurrFrameVisible = pIVar5->FrameCount;
      IVar4 = (pIVar5->Style).FramePadding;
      tab_bar->FramePadding = IVar4;
      local_50.x = tab_bar->OffsetMaxIdeal;
      local_50.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
      ItemSize(&local_50,IVar4.y);
      (pIVar7->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      col = GetColorU32((uint)((uVar11 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      local_50.y = (tab_bar->BarRect).Max.y + -1.0;
      if (pIVar6 == (ImGuiDockNode *)0x0) {
        local_38.x = (float)(int)((pIVar7->WindowPadding).x * 0.5);
        local_50.x = (tab_bar->BarRect).Min.x - local_38.x;
        local_38.x = (tab_bar->BarRect).Max.x + local_38.x;
        this = pIVar7->DrawList;
      }
      else {
        fVar1 = (pIVar6->Pos).x;
        local_50.x = fVar1 + pIVar7->WindowBorderSize;
        local_38.x = (fVar1 + (pIVar6->Size).x) - pIVar7->WindowBorderSize;
        this = pIVar7->DrawList;
      }
      local_38.y = local_50.y;
      ImDrawList::AddLine(this,&local_50,&local_38,col,1.0);
    }
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        //IMGUI_DEBUG_LOG("BeginTabBarEx already called this frame\n", g.FrameCount);
        //IM_ASSERT(0);
        return true;
    }

    // When toggling back from ordered to manually-reorderable, shuffle tabs to enforce the last visible order.
    // Otherwise, the most recently inserted tabs would move at the end of visible list which can be a little too confusing or magic for the user.
    if ((flags & ImGuiTabBarFlags_Reorderable) && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable) && tab_bar->Tabs.Size > 1 && tab_bar->PrevFrameVisible != -1)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByVisibleOffset);

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->FramePadding = g.Style.FramePadding;

    // Layout
    ItemSize(ImVec2(tab_bar->OffsetMaxIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.CursorPos.x = tab_bar->BarRect.Min.x;

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}